

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

cl_int clCommandFillImageKHR
                 (cl_command_buffer_khr command_buffer,cl_command_queue command_queue,
                 cl_command_properties_khr *properties,cl_mem image,void *fill_color,size_t *origin,
                 size_t *region,cl_uint num_sync_points_in_wait_list,
                 cl_sync_point_khr *sync_point_wait_list,cl_sync_point_khr *sync_point,
                 cl_mutable_command_khr *mutable_handle)

{
  _Rb_tree_header *p_Var1;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  byte bVar2;
  cl_int errorCode;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  mapped_type *pmVar5;
  time_point end;
  _Base_ptr p_Var6;
  time_point local_98;
  string local_90;
  uint64_t local_70;
  cl_command_queue local_68;
  cl_mem local_60;
  cl_command_properties_khr *local_58;
  string syncPointWaitList;
  
  pIntercept = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x472;
  }
  p_Var4 = (g_pIntercept->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_parent;
  if (p_Var4 == (_Base_ptr)0x0) {
LAB_00141eac:
    p_Var4 = (_Base_ptr)0x0;
  }
  else {
    p_Var1 = &(g_pIntercept->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (*(cl_command_buffer_khr *)(p_Var4 + 1) >= command_buffer) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(cl_command_buffer_khr *)(p_Var4 + 1) < command_buffer];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 == p_Var1) ||
       (command_buffer < *(cl_command_buffer_khr *)(p_Var3 + 1))) goto LAB_00141eac;
    p_Var4 = p_Var3[1]._M_parent;
  }
  p_Var3 = (g_pIntercept->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_68 = command_queue;
  local_60 = image;
  local_58 = properties;
  if (p_Var3 == (_Base_ptr)0x0) {
LAB_00141eeb:
    syncPointWaitList._M_dataplus._M_p = (pointer)0x0;
    pmVar5 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&g_pIntercept->m_DispatchX,(key_type *)&syncPointWaitList);
  }
  else {
    p_Var1 = &(g_pIntercept->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(_Base_ptr *)(p_Var3 + 1) >= p_Var4) {
        p_Var6 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(_Base_ptr *)(p_Var3 + 1) < p_Var4];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 == p_Var1) || (p_Var4 < *(_Base_ptr *)(p_Var6 + 1)))
    goto LAB_00141eeb;
    pmVar5 = (mapped_type *)&p_Var6[1]._M_parent;
  }
  if (pmVar5->clCommandFillImageKHR ==
      (_func_cl_int_cl_command_buffer_khr_cl_command_queue_cl_command_properties_khr_ptr_cl_mem_void_ptr_size_t_ptr_size_t_ptr_cl_uint_cl_sync_point_khr_ptr_cl_sync_point_khr_ptr_cl_mutable_command_khr_ptr
       *)0x0) {
    return -0x472;
  }
  enqueueCounter = (pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  getFormattedSyncPointWaitList_abi_cxx11_
            (&syncPointWaitList,pIntercept,num_sync_points_in_wait_list,sync_point_wait_list);
  if ((pIntercept->m_Config).CallLogging == true) {
    CLIntercept::callLoggingEnter
              (pIntercept,"clCommandFillImageKHR",enqueueCounter,(cl_kernel)0x0,
               "command_buffer = %p, command_queue = %p, image = %p%s",command_buffer,local_68,
               local_60,syncPointWaitList._M_dataplus._M_p);
  }
  local_70 = enqueueCounter;
  if (((pIntercept->m_Config).HostPerformanceTiming == false) &&
     ((pIntercept->m_Config).ChromeCallLogging != true)) {
    local_98.__d.__r = (duration)0;
  }
  else {
    local_98.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pmVar5->clCommandFillImageKHR)
                        (command_buffer,local_68,local_58,local_60,fill_color,origin,region,
                         num_sync_points_in_wait_list,sync_point_wait_list,sync_point,mutable_handle
                        );
  if (((pIntercept->m_Config).HostPerformanceTiming == false) &&
     ((pIntercept->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((pIntercept->m_Config).HostPerformanceTiming == true) &&
       (((pIntercept->m_Config).HostPerformanceTimingMinEnqueue <= local_70 &&
        (local_70 <= (pIntercept->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
      CLIntercept::updateHostTimingStats(pIntercept,"clCommandFillImageKHR",&local_90,local_98,end);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
    }
  }
  if ((pIntercept->m_Config).ErrorLogging == false) {
    bVar2 = (pIntercept->m_Config).ErrorAssert;
    if ((bool)bVar2 == false) {
      if ((errorCode == 0) || ((pIntercept->m_Config).NoErrors == false)) goto LAB_00142102;
    }
    else if (errorCode == 0) goto LAB_001420d5;
  }
  else {
    if (errorCode == 0) {
LAB_001420d5:
      errorCode = 0;
      goto LAB_00142102;
    }
    CLIntercept::logError(pIntercept,"clCommandFillImageKHR",errorCode);
    bVar2 = (pIntercept->m_Config).ErrorAssert;
  }
  if ((bVar2 & 1) != 0) {
    raise(5);
  }
  if ((pIntercept->m_Config).NoErrors != false) {
    errorCode = 0;
  }
LAB_00142102:
  if (((command_buffer != (cl_command_buffer_khr)0x0) && (errorCode == 0)) &&
     ((pIntercept->m_Config).DumpCommandBuffers == true)) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    CLIntercept::recordCommandBufferCommand
              (pIntercept,command_buffer,"clCommandFillImageKHR",&local_90,
               num_sync_points_in_wait_list,sync_point_wait_list,sync_point);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  if ((pIntercept->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (pIntercept,"clCommandFillImageKHR",errorCode,(cl_event *)0x0,sync_point);
  }
  if ((pIntercept->m_Config).ChromeCallLogging == true) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    CLIntercept::chromeCallLoggingExit
              (pIntercept,"clCommandFillImageKHR",&local_90,true,local_70,local_98,end);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  if ((mutable_handle != (cl_mutable_command_khr *)0x0) &&
     (*mutable_handle != (cl_mutable_command_khr)0x0)) {
    CLIntercept::addMutableCommandInfo(pIntercept,*mutable_handle,command_buffer,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)syncPointWaitList._M_dataplus._M_p != &syncPointWaitList.field_2) {
    operator_delete(syncPointWaitList._M_dataplus._M_p);
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clCommandFillImageKHR(
    cl_command_buffer_khr command_buffer,
    cl_command_queue command_queue,
    const cl_command_properties_khr* properties,
    cl_mem image,
    const void* fill_color,
    const size_t* origin,
    const size_t* region,
    cl_uint num_sync_points_in_wait_list,
    const cl_sync_point_khr* sync_point_wait_list,
    cl_sync_point_khr* sync_point,
    cl_mutable_command_khr* mutable_handle)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clCommandFillImageKHR )
        {
            GET_ENQUEUE_COUNTER();

            const std::string syncPointWaitList = getFormattedSyncPointWaitList(
                pIntercept,
                num_sync_points_in_wait_list,
                sync_point_wait_list);

            CALL_LOGGING_ENTER(
                "command_buffer = %p, command_queue = %p, image = %p%s",
                command_buffer,
                command_queue,
                image,
                syncPointWaitList.c_str() );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clCommandFillImageKHR(
                command_buffer,
                command_queue,
                properties,
                image,
                fill_color,
                origin,
                region,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point,
                mutable_handle );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            RECORD_COMMAND_BUFFER_COMMAND(
                retVal,
                command_buffer,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point );
            CALL_LOGGING_EXIT_SYNC_POINT( retVal, sync_point );
            ADD_MUTABLE_COMMAND( mutable_handle, command_buffer );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}